

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLogSink.h
# Opt level: O3

void __thiscall MessageLogSink<std::mutex>::MessageLogSink(MessageLogSink<std::mutex> *this)

{
  array<std::pair<sf::Color,_unsigned_int>,_7UL> *paVar1;
  long lVar2;
  
  spdlog::sinks::base_sink<std::mutex>::base_sink(&this->super_base_sink<std::mutex>);
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__MessageLogSink_0027a1b0;
  (this->chatBox_).super___weak_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->chatBox_).super___weak_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bufferedMessages_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bufferedMessages_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bufferedMessages_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[0].first.r = '\0';
  paVar1->_M_elems[0].first.g = '\0';
  paVar1->_M_elems[0].first.b = '\0';
  paVar1->_M_elems[0].first.a = '\0';
  (this->styles_)._M_elems[0].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[1].first.r = '\0';
  paVar1->_M_elems[1].first.g = '\0';
  paVar1->_M_elems[1].first.b = '\0';
  paVar1->_M_elems[1].first.a = '\0';
  (this->styles_)._M_elems[1].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[2].first.r = '\0';
  paVar1->_M_elems[2].first.g = '\0';
  paVar1->_M_elems[2].first.b = '\0';
  paVar1->_M_elems[2].first.a = '\0';
  (this->styles_)._M_elems[2].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[3].first.r = '\0';
  paVar1->_M_elems[3].first.g = '\0';
  paVar1->_M_elems[3].first.b = '\0';
  paVar1->_M_elems[3].first.a = '\0';
  (this->styles_)._M_elems[3].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[4].first.r = '\0';
  paVar1->_M_elems[4].first.g = '\0';
  paVar1->_M_elems[4].first.b = '\0';
  paVar1->_M_elems[4].first.a = '\0';
  (this->styles_)._M_elems[4].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[5].first.r = '\0';
  paVar1->_M_elems[5].first.g = '\0';
  paVar1->_M_elems[5].first.b = '\0';
  paVar1->_M_elems[5].first.a = '\0';
  (this->styles_)._M_elems[5].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[6].first.r = '\0';
  paVar1->_M_elems[6].first.g = '\0';
  paVar1->_M_elems[6].first.b = '\0';
  paVar1->_M_elems[6].first.a = '\0';
  (this->styles_)._M_elems[6].second = 0;
  lVar2 = 0;
  do {
    sf::Color::Color((Color *)(&(this->styles_)._M_elems[0].first.r + lVar2));
    *(undefined4 *)((long)&(this->styles_)._M_elems[0].second + lVar2) = 0;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x38);
  (this->styles_)._M_elems[0].first.r = 0xff;
  (this->styles_)._M_elems[0].first.g = 0xff;
  (this->styles_)._M_elems[0].first.b = 0xff;
  (this->styles_)._M_elems[0].first.a = 0xff;
  (this->styles_)._M_elems[0].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[1].first.r = '\0';
  paVar1->_M_elems[1].first.g = 0xff;
  paVar1->_M_elems[1].first.b = 0xff;
  paVar1->_M_elems[1].first.a = 0xff;
  (this->styles_)._M_elems[1].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[2].first.r = '\0';
  paVar1->_M_elems[2].first.g = 0xff;
  paVar1->_M_elems[2].first.b = '\0';
  paVar1->_M_elems[2].first.a = 0xff;
  (this->styles_)._M_elems[2].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[3].first.r = 0xff;
  paVar1->_M_elems[3].first.g = 0xff;
  paVar1->_M_elems[3].first.b = '\0';
  paVar1->_M_elems[3].first.a = 0xff;
  (this->styles_)._M_elems[3].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[4].first.r = 0xff;
  paVar1->_M_elems[4].first.g = '\0';
  paVar1->_M_elems[4].first.b = '\0';
  paVar1->_M_elems[4].first.a = 0xff;
  (this->styles_)._M_elems[4].second = 0;
  paVar1 = &this->styles_;
  paVar1->_M_elems[5].first.r = 0xff;
  paVar1->_M_elems[5].first.g = '\0';
  paVar1->_M_elems[5].first.b = '\0';
  paVar1->_M_elems[5].first.a = 0xff;
  (this->styles_)._M_elems[5].second = 2;
  paVar1 = &this->styles_;
  paVar1->_M_elems[6].first.r = 0xff;
  paVar1->_M_elems[6].first.g = 0xff;
  paVar1->_M_elems[6].first.b = 0xff;
  paVar1->_M_elems[6].first.a = 0xff;
  (this->styles_)._M_elems[6].second = 0;
  return;
}

Assistant:

MessageLogSink() :
        chatBox_(),
        bufferedMessages_(),
        styles_() {

        styles_[spdlog::level::trace] = {sf::Color::White, sf::Text::Regular};
        styles_[spdlog::level::debug] = {sf::Color::Cyan, sf::Text::Regular};
        styles_[spdlog::level::info] = {sf::Color::Green, sf::Text::Regular};
        styles_[spdlog::level::warn] = {sf::Color::Yellow, sf::Text::Regular};
        styles_[spdlog::level::err] = {sf::Color::Red, sf::Text::Regular};
        styles_[spdlog::level::critical] = {sf::Color::Red, sf::Text::Italic};
        styles_[spdlog::level::off] = {sf::Color::White, sf::Text::Regular};
    }